

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifadw(bifcxdef *ctx,int argc)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_ESI;
  long in_RDI;
  voccxdef *voc;
  int classflg;
  vocidef *voci;
  prpnum prpn;
  objnum objn;
  uchar *wrd;
  undefined8 in_stack_ffffffffffffffb8;
  int err;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  long lVar4;
  undefined4 in_stack_ffffffffffffffe0;
  ushort uVar5;
  ushort uVar6;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar4 = *(long *)(*(long *)(in_RDI + 8) + 0x70);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  err = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if (*(char *)(lVar1 + -0x10) != '\x02') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),err);
  }
  uVar6 = *(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\r') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)(ulong)CONCAT24(uVar6,in_stack_ffffffffffffffc0),err);
  }
  uVar5 = *(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x03') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)(ulong)CONCAT24(uVar6,(uint)uVar5),err);
  }
  uVar2 = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  if ((1 < uVar5) && (uVar5 < 8)) {
    lVar4 = *(long *)(*(long *)(lVar4 + 0x58 + (long)((int)(uint)uVar6 >> 8) * 8) +
                     (long)(int)(uVar6 & 0xff) * 8);
    uVar3 = 4;
    if ((*(byte *)(lVar4 + 8) & 1) != 0) {
      uVar3 = 5;
    }
    vocadd((voccxdef *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(prpnum)((ulong)uVar2 >> 0x30),
           (objnum)((ulong)uVar2 >> 0x20),(int)uVar2,
           (char *)CONCAT26(uVar6,CONCAT24(uVar5,in_stack_ffffffffffffffe0)));
    vocdusave_addwrd((voccxdef *)CONCAT26(uVar6,CONCAT24(uVar5,in_stack_ffffffffffffffe0)),
                     (objnum)((ulong)lVar4 >> 0x30),(prpnum)((ulong)lVar4 >> 0x20),(int)lVar4,
                     (char *)CONCAT44(uVar3,in_stack_ffffffffffffffd0));
    return;
  }
  *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "addword";
  *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
  runsign((runcxdef *)(ulong)CONCAT24(uVar6,(uint)uVar5),(int)((ulong)uVar2 >> 0x20));
}

Assistant:

void bifadw(bifcxdef *ctx, int argc)
{
    uchar    *wrd;
    objnum    objn;
    prpnum    prpn;
    vocidef  *voci;
    int       classflg;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;

    bifcntargs(ctx, 3, argc);

    /* get the arguments */
    objn = runpopobj(ctx->bifcxrun);
    prpn = runpopprp(ctx->bifcxrun);
    wrd = runpopstr(ctx->bifcxrun);

    /* make sure the property is a valid part of speech property */
    if (!prpisvoc(prpn))
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "addword");

    /* get the vocidef for the object, and see if it's a class object */
    voci = vocinh(voc, objn);

    classflg = VOCFNEW;
    if (voci->vociflg & VOCIFCLASS) classflg |= VOCFCLASS;

    /* add the word */
    vocadd(voc, prpn, objn, classflg, (char *)wrd);

    /* generate undo for the operation */
    vocdusave_addwrd(voc, objn, prpn, classflg, (char *)wrd);
}